

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O0

void __thiscall
chatra::TemporaryObject::selectElement(TemporaryObject *this,Node *node,StringId name)

{
  Thread *pTVar1;
  Node *pNVar2;
  bool bVar3;
  ReferenceValueType RVar4;
  RuntimeException *pRVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  allocator local_119;
  string local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  allocator local_d9;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  allocator local_99;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78 [2];
  allocator local_41;
  string local_40;
  StringId local_1c;
  Node *pNStack_18;
  StringId name_local;
  Node *node_local;
  TemporaryObject *this_local;
  
  local_1c = name;
  pNStack_18 = node;
  node_local = (Node *)this;
  if ((this->type == Rvalue) &&
     (RVar4 = Reference::valueType(&this->targetRef), pNVar2 = pNStack_18, RVar4 != Object)) {
    pTVar1 = this->thread;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"invalid suffix or element selection on primitive",&local_41);
    local_78[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(local_78);
    errorAtNode(&pTVar1->super_IErrorReceiver,Error,pNVar2,&local_40,local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_78);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    pRVar5 = (RuntimeException *)__cxa_allocate_exception(0x10);
    RuntimeException::RuntimeException(pRVar5,UnsupportedOperationException);
    __cxa_throw(pRVar5,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  pNVar2 = pNStack_18;
  if ((local_1c != Self) && (local_1c != Super)) {
    if (((this->type == ScopeRef) || (this->type == ObjectRef)) &&
       (RVar4 = Reference::valueType(&this->targetRef), pNVar2 = pNStack_18, RVar4 != Object)) {
      pTVar1 = this->thread;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_d8,"base type of element selection is not object",&local_d9);
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_f8);
      errorAtNode(&pTVar1->super_IErrorReceiver,Error,pNVar2,&local_d8,&local_f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      pRVar5 = (RuntimeException *)__cxa_allocate_exception(0x10);
      RuntimeException::RuntimeException(pRVar5,UnsupportedOperationException);
      __cxa_throw(pRVar5,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
    bVar3 = hasRef(this);
    if ((bVar3) && (bVar3 = Reference::isNull(&this->targetRef), pNVar2 = pNStack_18, bVar3)) {
      pTVar1 = this->thread;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_118,"de-referencing null",&local_119);
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_138);
      errorAtNode(&pTVar1->super_IErrorReceiver,Error,pNVar2,&local_118,&local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_138);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
      pRVar5 = (RuntimeException *)__cxa_allocate_exception(0x10);
      RuntimeException::RuntimeException(pRVar5,NullReferenceException);
      __cxa_throw(pRVar5,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
    if (pNStack_18 != (Node *)0x0) {
      this->node = pNStack_18;
    }
    this->name = local_1c;
    this->hasName = true;
    return;
  }
  pTVar1 = this->thread;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_98,"cannot access \"self\" or \"super\" from outside class",&local_99)
  ;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_b8);
  errorAtNode(&pTVar1->super_IErrorReceiver,Error,pNVar2,&local_98,&local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  pRVar5 = (RuntimeException *)__cxa_allocate_exception(0x10);
  RuntimeException::RuntimeException(pRVar5,UnsupportedOperationException);
  __cxa_throw(pRVar5,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
}

Assistant:

void TemporaryObject::selectElement(Node* node, StringId name) {
	chatra_assert(!requiresEvaluate());
	chatra_assert(!hasArgs && !hasSetArg);
	chatra_assert(type != Type::Empty);
	chatra_assert(!hasMethods());

	if (type == Type::Rvalue && targetRef.valueType() != ReferenceValueType::Object) {
		errorAtNode(thread, ErrorLevel::Error, node, "invalid suffix or element selection on primitive", {});
		throw RuntimeException(StringId::UnsupportedOperationException);
	}
	if (name == StringId::Self || name == StringId::Super) {
		errorAtNode(thread, ErrorLevel::Error, node, R"(cannot access "self" or "super" from outside class)", {});
		throw RuntimeException(StringId::UnsupportedOperationException);
	}
	if ((type == Type::ScopeRef || type == Type::ObjectRef) && targetRef.valueType() != ReferenceValueType::Object) {
		errorAtNode(thread, ErrorLevel::Error, node, "base type of element selection is not object", {});
		throw RuntimeException(StringId::UnsupportedOperationException);
	}
	if (hasRef() && targetRef.isNull()) {
		errorAtNode(thread, ErrorLevel::Error, node, "de-referencing null", {});
		throw RuntimeException(StringId::NullReferenceException);
	}

	if (node != nullptr)
		this->node = node;
	this->name = name;
	hasName = true;
}